

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cxx
# Opt level: O2

void __thiscall
trento::Event::compute
          (Event *this,Nucleus *nucleusA,Nucleus *nucleusB,NucleonCommon *nucleon_common)

{
  this->npart_ = 0;
  compute_nuclear_thickness(this,nucleusA,nucleon_common,&this->TA_);
  compute_nuclear_thickness(this,nucleusB,nucleon_common,&this->TB_);
  std::function<void_()>::operator()(&this->compute_reduced_thickness_);
  compute_observables(this);
  return;
}

Assistant:

void Event::compute(const Nucleus& nucleusA, const Nucleus& nucleusB,
                    const NucleonCommon& nucleon_common) {
  // Reset npart; compute_nuclear_thickness() increments it.
  npart_ = 0;
  compute_nuclear_thickness(nucleusA, nucleon_common, TA_);
  compute_nuclear_thickness(nucleusB, nucleon_common, TB_);
  compute_reduced_thickness_();
  compute_observables();
}